

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

bool __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::Load(TimeZoneInfo *this,string *name)

{
  bool bVar1;
  pointer *__ptr;
  unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,_std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>_>
  zip;
  duration<long,_std::ratio<1L,_1L>_> offset;
  ZoneInfoSource *local_48;
  seconds local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  code *local_20;
  
  local_40.__r = 0;
  bVar1 = FixedOffsetFromName(name,&local_40);
  if (bVar1) {
    ResetToBuiltinUTC(this,&local_40);
    bVar1 = true;
  }
  else {
    local_38 = 0;
    uStack_30 = 0;
    local_20 = std::
               _Function_handler<std::unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,_std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc:820:13)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<std::unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,_std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc:820:13)>
               ::_M_manager;
    (*(code *)cctz_extension::zone_info_source_factory_abi_cxx11_)(&local_48,name);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,3);
    }
    if (local_48 == (ZoneInfoSource *)0x0) {
      bVar1 = false;
    }
    else {
      bVar1 = Load(this,local_48);
    }
    if (local_48 != (ZoneInfoSource *)0x0) {
      (*local_48->_vptr_ZoneInfoSource[1])();
    }
  }
  return bVar1;
}

Assistant:

bool TimeZoneInfo::Load(const std::string& name) {
  // We can ensure that the loading of UTC or any other fixed-offset
  // zone never fails because the simple, fixed-offset state can be
  // internally generated. Note that this depends on our choice to not
  // accept leap-second encoded ("right") zoneinfo.
  auto offset = seconds::zero();
  if (FixedOffsetFromName(name, &offset)) {
    return ResetToBuiltinUTC(offset);
  }

  // Find and use a ZoneInfoSource to load the named zone.
  auto zip = cctz_extension::zone_info_source_factory(
      name, [](const std::string& n) -> std::unique_ptr<ZoneInfoSource> {
        if (auto z = FileZoneInfoSource::Open(n)) return z;
        if (auto z = AndroidZoneInfoSource::Open(n)) return z;
        if (auto z = FuchsiaZoneInfoSource::Open(n)) return z;
        return nullptr;
      });
  return zip != nullptr && Load(zip.get());
}